

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O0

IDeckLinkNotificationCallback *
cdecklink_internal_callback_create_deck_link_notification_callback
          (void *ctx,cdecklink_notification_callback_notify *cb0)

{
  cdecklink_notification_callback_notify *cb0_local;
  void *ctx_local;
  
  if (cb0 == (cdecklink_notification_callback_notify *)0x0) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = operator_new(0x20);
    DeckLinkNotificationCallback::DeckLinkNotificationCallback
              ((DeckLinkNotificationCallback *)ctx_local,ctx,cb0);
  }
  return (IDeckLinkNotificationCallback *)ctx_local;
}

Assistant:

IDeckLinkNotificationCallback* cdecklink_internal_callback_create_deck_link_notification_callback (void *ctx, cdecklink_notification_callback_notify *cb0) {
	if (cb0 != nullptr) {
		return new DeckLinkNotificationCallback(ctx, cb0);
	}
	return nullptr;
}